

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Segment.cpp
# Opt level: O3

void __thiscall CSegment::Print(CSegment *this,FILE *pFile,int Mode)

{
  CPoint *pCVar1;
  CPoint *pCVar2;
  
  if (pFile == (FILE *)0x0) {
    return;
  }
  if (Mode == 0) {
    pCVar1 = this->m_pPointE;
    pCVar2 = this->m_pPointS;
    fprintf((FILE *)pFile,"(%d,%d,%d)-(%d,%d,%d)\n",(ulong)(uint)(int)pCVar2->m_iX,
            (ulong)(uint)(int)pCVar2->m_iY,(ulong)(uint)(int)pCVar2->m_cZ,
            (ulong)(uint)(int)pCVar1->m_iX,(ulong)(uint)(int)pCVar1->m_iY,
            (ulong)(uint)(int)pCVar1->m_cZ);
    fflush((FILE *)pFile);
    return;
  }
  __assert_fail("FALSE",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Apodead[P]BoxRouter/br_64bit_release/Segment.cpp"
                ,0xf0,"virtual void CSegment::Print(FILE *, int)");
}

Assistant:

void CSegment::Print(FILE *pFile, int Mode)
{
	if(pFile==NULL)	return;

	switch(Mode){
	case PRINT_MODE_TEXT:
		fprintf(pFile,"(%d,%d,%d)-(%d,%d,%d)\n",
			m_pPointS->X(),m_pPointS->Y(),m_pPointS->Z(),
			m_pPointE->X(),m_pPointE->Y(),m_pPointE->Z());
		break;
	default:
		assert(FALSE);
		break;
	}

	fflush(pFile);
}